

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.c
# Opt level: O0

ma_result ma_spatializer_process_pcm_frames
                    (ma_spatializer *pSpatializer,ma_spatializer_listener *pListener,
                    void *pFramesOut,void *pFramesIn,ma_uint64 frameCount)

{
  float *pfVar1;
  ma_channel *pChannelMapIn_00;
  ma_channel *pChannelMapOut_00;
  ma_vec3f listenVelocity;
  ma_vec3f a;
  ma_vec3f dirB;
  ma_vec3f dirA;
  ma_vec3f dirA_00;
  ma_vec3f a_00;
  ma_uint32 mVar2;
  ma_channel channelPosition;
  ma_bool32 mVar3;
  ma_positioning mVar4;
  ma_attenuation_model mVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  ma_vec3f mVar9;
  float local_2c0;
  float local_2b8;
  float local_2b0;
  float local_2ac;
  float local_1e8;
  float dMin;
  float d;
  float fStack_1dc;
  ma_channel channelOut;
  float distanceInv_1;
  ma_vec3f unitPos;
  undefined8 local_1b0;
  float local_1a8;
  undefined8 local_190;
  float local_188;
  float listenerOuterGain;
  float listenerOuterAngle;
  float listenerInnerAngle;
  ma_vec3f listenerDirection;
  float local_10c;
  float local_108;
  float spatializerConeOuterGain;
  float spatializerConeOuterAngle;
  float spatializerConeInnerAngle;
  float local_f8;
  float local_f0;
  float fStack_ec;
  float local_e8;
  float local_e4;
  float fStack_e0;
  float distanceInv;
  float local_d8;
  ma_vec3f local_d0;
  undefined8 local_c0;
  float local_b8;
  float local_b4;
  float local_b0;
  float dopplerFactor;
  float rolloff;
  float maxDistance;
  float minDistance;
  ma_uint32 channelsIn;
  ma_uint32 channelsOut;
  ma_uint32 iChannel;
  float gain;
  float distance;
  float speedOfSound;
  ma_vec3f listenerVel;
  ma_vec3f relativeDir;
  ma_vec3f relativePos;
  ma_vec3f relativePosNormalized;
  ma_channel *pChannelMapOut;
  ma_channel *pChannelMapIn;
  ma_uint64 frameCount_local;
  void *pFramesIn_local;
  void *pFramesOut_local;
  ma_spatializer_listener *pListener_local;
  ma_spatializer *pSpatializer_local;
  float r1;
  float r0;
  
  pChannelMapIn_00 = pSpatializer->pChannelMapIn;
  pChannelMapOut_00 = (pListener->config).pChannelMapOut;
  if (pSpatializer == (ma_spatializer *)0x0) {
    return MA_INVALID_ARGS;
  }
  if (pSpatializer->attenuationModel == ma_attenuation_model_none) {
    mVar3 = ma_spatializer_listener_is_enabled(pListener);
    if (mVar3 == 0) {
      ma_silence_pcm_frames(pFramesOut,frameCount,ma_format_f32,pSpatializer->channelsOut);
    }
    else if (pSpatializer->channelsIn == pSpatializer->channelsOut) {
      ma_copy_pcm_frames(pFramesOut,pFramesIn,frameCount,ma_format_f32,pSpatializer->channelsIn);
    }
    else {
      ma_channel_map_apply_f32
                ((float *)pFramesOut,pChannelMapOut_00,pSpatializer->channelsOut,(float *)pFramesIn,
                 pChannelMapIn_00,pSpatializer->channelsIn,frameCount,ma_channel_mix_mode_default,
                 ma_mono_expansion_mode_default);
    }
    pSpatializer->dopplerPitch = 1.0;
    return MA_SUCCESS;
  }
  iChannel = 0;
  channelsOut = 0x3f800000;
  minDistance = (float)pSpatializer->channelsOut;
  maxDistance = (float)pSpatializer->channelsIn;
  rolloff = ma_spatializer_get_min_distance(pSpatializer);
  dopplerFactor = ma_spatializer_get_max_distance(pSpatializer);
  local_b0 = ma_spatializer_get_rolloff(pSpatializer);
  local_b4 = ma_spatializer_get_doppler_factor(pSpatializer);
  if (pListener == (ma_spatializer_listener *)0x0) {
    mVar9 = ma_vec3f_init_3f(0.0,0.0,0.0);
    local_d0._0_8_ = mVar9._0_8_;
    local_c0._0_4_ = local_d0.x;
    local_c0._4_4_ = local_d0.y;
    local_d0.z = mVar9.z;
    local_b8 = local_d0.z;
    distance = local_d0.x;
    speedOfSound = local_d0.y;
    listenerVel.x = local_d0.z;
    gain = 343.3;
    local_d0 = mVar9;
  }
  else {
    distance = (pListener->velocity).x;
    speedOfSound = (pListener->velocity).y;
    listenerVel.x = (pListener->velocity).z;
    gain = (pListener->config).speedOfSound;
    mVar4 = ma_spatializer_get_positioning(pSpatializer);
    if (mVar4 != ma_positioning_relative) {
      ma_spatializer_get_relative_position_and_direction
                (pSpatializer,pListener,(ma_vec3f *)&relativeDir.y,(ma_vec3f *)&listenerVel.y);
      goto LAB_002353ff;
    }
  }
  relativeDir.y = (pSpatializer->position).x;
  relativeDir.z = (pSpatializer->position).y;
  relativePos.x = (pSpatializer->position).z;
  listenerVel.y = (pSpatializer->direction).x;
  listenerVel.z = (pSpatializer->direction).y;
  relativeDir.x = (pSpatializer->direction).z;
LAB_002353ff:
  local_d8 = relativePos.x;
  fStack_e0 = relativeDir.y;
  distanceInv = relativeDir.z;
  mVar9.z = relativePos.x;
  mVar9.x = relativeDir.y;
  mVar9.y = relativeDir.z;
  iChannel = (ma_uint32)ma_vec3f_len(mVar9);
  mVar5 = ma_spatializer_get_attenuation_model(pSpatializer);
  switch(mVar5) {
  case ma_attenuation_model_none:
  default:
    channelsOut = 0x3f800000;
    break;
  case ma_attenuation_model_inverse:
    channelsOut = (ma_uint32)ma_attenuation_inverse((float)iChannel,rolloff,dopplerFactor,local_b0);
    break;
  case ma_attenuation_model_linear:
    channelsOut = (ma_uint32)ma_attenuation_linear((float)iChannel,rolloff,dopplerFactor,local_b0);
    break;
  case ma_attenuation_model_exponential:
    channelsOut = (ma_uint32)
                  ma_attenuation_exponential((float)iChannel,rolloff,dopplerFactor,local_b0);
  }
  if ((float)iChannel <= 0.001) {
    iChannel = 0;
    mVar9 = ma_vec3f_init_3f(0.0,0.0,0.0);
    _spatializerConeOuterAngle = mVar9._0_8_;
    local_f0 = spatializerConeOuterAngle;
    fStack_ec = spatializerConeInnerAngle;
    local_f8 = mVar9.z;
    local_e8 = local_f8;
    relativePos.y = spatializerConeOuterAngle;
    relativePos.z = spatializerConeInnerAngle;
    relativePosNormalized.x = local_f8;
    _spatializerConeOuterAngle = mVar9;
  }
  else {
    local_e4 = 1.0 / (float)iChannel;
    relativePos.y = relativeDir.y;
    relativePos.z = relativeDir.z;
    relativePos.z = local_e4 * relativePos.z;
    relativePos.y = local_e4 * relativePos.y;
    relativePosNormalized.x = local_e4 * relativePos.x;
  }
  if (0.0 < (float)iChannel) {
    ma_spatializer_get_cone(pSpatializer,&spatializerConeOuterGain,&local_108,&local_10c);
    a_00.z = relativePosNormalized.x;
    a_00.x = relativePos.y;
    a_00.y = relativePos.z;
    mVar9 = ma_vec3f_neg(a_00);
    dirA_00.z = relativeDir.x;
    dirA_00.x = listenerVel.y;
    dirA_00.y = listenerVel.z;
    fVar6 = ma_calculate_angular_gain(dirA_00,mVar9,spatializerConeOuterGain,local_108,local_10c);
    channelsOut = (ma_uint32)(fVar6 * (float)channelsOut);
    if ((pListener != (ma_spatializer_listener *)0x0) &&
       (pfVar1 = &(pListener->config).coneInnerAngleInRadians,
       *pfVar1 <= 6.283185 && *pfVar1 != 6.283185)) {
      if ((pListener->config).handedness == ma_handedness_right) {
        mVar9 = ma_vec3f_init_3f(0.0,0.0,-1.0);
        local_190 = mVar9._0_8_;
        local_188 = mVar9.z;
        _listenerOuterAngle = local_190;
        listenerDirection.x = local_188;
      }
      else {
        mVar9 = ma_vec3f_init_3f(0.0,0.0,1.0);
        local_1b0 = mVar9._0_8_;
        local_1a8 = mVar9.z;
        _listenerOuterAngle = local_1b0;
        listenerDirection.x = local_1a8;
      }
      dirA.z = listenerDirection.x;
      dirA.x = listenerOuterAngle;
      dirA.y = listenerInnerAngle;
      dirB.z = relativePosNormalized.x;
      dirB.x = relativePos.y;
      dirB.y = relativePos.z;
      fVar6 = ma_calculate_angular_gain
                        (dirA,dirB,(pListener->config).coneInnerAngleInRadians,
                         (pListener->config).coneOuterAngleInRadians,
                         (pListener->config).coneOuterGain);
      channelsOut = (ma_uint32)(fVar6 * (float)channelsOut);
    }
  }
  fVar6 = ma_spatializer_get_min_gain(pSpatializer);
  mVar2 = channelsOut;
  fVar7 = ma_spatializer_get_max_gain(pSpatializer);
  if (fVar7 <= (float)mVar2) {
    local_2ac = ma_spatializer_get_max_gain(pSpatializer);
  }
  else {
    local_2ac = (float)channelsOut;
  }
  mVar2 = channelsOut;
  if (fVar6 <= local_2ac) {
    fVar6 = ma_spatializer_get_max_gain(pSpatializer);
    if (fVar6 <= (float)mVar2) {
      local_2b8 = ma_spatializer_get_max_gain(pSpatializer);
    }
    else {
      local_2b8 = (float)channelsOut;
    }
    local_2b0 = local_2b8;
  }
  else {
    local_2b0 = ma_spatializer_get_min_gain(pSpatializer);
  }
  channelsOut = (ma_uint32)local_2b0;
  if (pChannelMapOut_00 != (ma_channel *)0x0) {
    for (channelsIn = 0; channelsIn < (uint)minDistance; channelsIn = channelsIn + 1) {
      pSpatializer->pNewChannelGainsOut[channelsIn] = local_2b0;
    }
    mVar3 = ma_spatializer_listener_is_enabled(pListener);
    if (mVar3 == 0) {
      ma_silence_pcm_frames(pFramesOut,frameCount,ma_format_f32,pSpatializer->channelsOut);
    }
    else {
      ma_channel_map_apply_f32
                ((float *)pFramesOut,pChannelMapOut_00,(ma_uint32)minDistance,(float *)pFramesIn,
                 pChannelMapIn_00,(ma_uint32)maxDistance,frameCount,ma_channel_mix_mode_default,
                 ma_mono_expansion_mode_default);
    }
    if (0.0 < (float)iChannel) {
      fVar6 = 1.0 / (float)iChannel;
      fStack_1dc = relativeDir.y;
      distanceInv_1 = relativeDir.z;
      for (channelsIn = 0; channelsIn < (uint)minDistance; channelsIn = channelsIn + 1) {
        channelPosition =
             ma_channel_map_get_channel(pChannelMapOut_00,(ma_uint32)minDistance,channelsIn);
        mVar3 = ma_is_spatial_channel_position(channelPosition);
        if (mVar3 == 0) {
          local_1e8 = 1.0;
        }
        else {
          mVar9 = ma_get_channel_direction(channelPosition);
          a.z = fVar6 * relativePos.x;
          a.x = fVar6 * fStack_1dc;
          a.y = fVar6 * distanceInv_1;
          fVar7 = ma_vec3f_dot(a,mVar9);
          fVar8 = ma_spatializer_get_directional_attenuation_factor(pSpatializer);
          local_1e8 = (fVar7 - 1.0) * fVar8 + 1.0;
        }
        local_2c0 = (local_1e8 + 1.0) * 0.5;
        if (local_2c0 <= 0.2) {
          local_2c0 = 0.2;
        }
        pSpatializer->pNewChannelGainsOut[channelsIn] =
             local_2c0 * pSpatializer->pNewChannelGainsOut[channelsIn];
      }
    }
    ma_gainer_set_gains(&pSpatializer->gainer,pSpatializer->pNewChannelGainsOut);
    ma_gainer_process_pcm_frames(&pSpatializer->gainer,pFramesOut,pFramesOut,frameCount);
    if (local_b4 <= 0.0) {
      pSpatializer->dopplerPitch = 1.0;
    }
    else {
      mVar9 = ma_vec3f_sub(pListener->position,pSpatializer->position);
      listenVelocity.z = listenerVel.x;
      listenVelocity.x = distance;
      listenVelocity.y = speedOfSound;
      fVar6 = ma_doppler_pitch(mVar9,pSpatializer->velocity,listenVelocity,gain,local_b4);
      pSpatializer->dopplerPitch = fVar6;
    }
    return MA_SUCCESS;
  }
  __assert_fail("pChannelMapOut != ((void*)0)",
                "/workspace/llm4binary/github/license_c_cmakelists/stoneface86[P]trackerboy/vendored/miniaudio/miniaudio.c"
                ,0x9414,
                "ma_result ma_spatializer_process_pcm_frames(ma_spatializer *, ma_spatializer_listener *, void *, const void *, ma_uint64)"
               );
}

Assistant:

MA_API ma_result ma_spatializer_process_pcm_frames(ma_spatializer* pSpatializer, ma_spatializer_listener* pListener, void* pFramesOut, const void* pFramesIn, ma_uint64 frameCount)
{
    ma_channel* pChannelMapIn  = pSpatializer->pChannelMapIn;
    ma_channel* pChannelMapOut = pListener->config.pChannelMapOut;

    if (pSpatializer == NULL) {
        return MA_INVALID_ARGS;
    }

    /* If we're not spatializing we need to run an optimized path. */
    if (c89atomic_load_i32(&pSpatializer->attenuationModel) == ma_attenuation_model_none) {
        if (ma_spatializer_listener_is_enabled(pListener)) {
            /* No attenuation is required, but we'll need to do some channel conversion. */
            if (pSpatializer->channelsIn == pSpatializer->channelsOut) {
                ma_copy_pcm_frames(pFramesOut, pFramesIn, frameCount, ma_format_f32, pSpatializer->channelsIn);
            } else {
                ma_channel_map_apply_f32((float*)pFramesOut, pChannelMapOut, pSpatializer->channelsOut, (const float*)pFramesIn, pChannelMapIn, pSpatializer->channelsIn, frameCount, ma_channel_mix_mode_rectangular, ma_mono_expansion_mode_default);   /* Safe casts to float* because f32 is the only supported format. */
            }
        } else {
            /* The listener is disabled. Output silence. */
            ma_silence_pcm_frames(pFramesOut, frameCount, ma_format_f32, pSpatializer->channelsOut);
        }

        /*
        We're not doing attenuation so don't bother with doppler for now. I'm not sure if this is
        the correct thinking so might need to review this later.
        */
        pSpatializer->dopplerPitch = 1;
    } else {
        /*
        Let's first determine which listener the sound is closest to. Need to keep in mind that we
        might not have a world or any listeners, in which case we just spatializer based on the
        listener being positioned at the origin (0, 0, 0).
        */
        ma_vec3f relativePosNormalized;
        ma_vec3f relativePos;   /* The position relative to the listener. */
        ma_vec3f relativeDir;   /* The direction of the sound, relative to the listener. */
        ma_vec3f listenerVel;   /* The volocity of the listener. For doppler pitch calculation. */
        float speedOfSound;
        float distance = 0;
        float gain = 1;
        ma_uint32 iChannel;
        const ma_uint32 channelsOut = pSpatializer->channelsOut;
        const ma_uint32 channelsIn  = pSpatializer->channelsIn;
        float minDistance = ma_spatializer_get_min_distance(pSpatializer);
        float maxDistance = ma_spatializer_get_max_distance(pSpatializer);
        float rolloff = ma_spatializer_get_rolloff(pSpatializer);
        float dopplerFactor = ma_spatializer_get_doppler_factor(pSpatializer);

        /*
        We'll need the listener velocity for doppler pitch calculations. The speed of sound is
        defined by the listener, so we'll grab that here too.
        */
        if (pListener != NULL) {
            listenerVel  = pListener->velocity;
            speedOfSound = pListener->config.speedOfSound;
        } else {
            listenerVel  = ma_vec3f_init_3f(0, 0, 0);
            speedOfSound = MA_DEFAULT_SPEED_OF_SOUND;
        }

        if (pListener == NULL || ma_spatializer_get_positioning(pSpatializer) == ma_positioning_relative) {
            /* There's no listener or we're using relative positioning. */
            relativePos = pSpatializer->position;
            relativeDir = pSpatializer->direction;
        } else {
            /*
            We've found a listener and we're using absolute positioning. We need to transform the
            sound's position and direction so that it's relative to listener. Later on we'll use
            this for determining the factors to apply to each channel to apply the panning effect.
            */
            ma_spatializer_get_relative_position_and_direction(pSpatializer, pListener, &relativePos, &relativeDir);
        }

        distance = ma_vec3f_len(relativePos);

        /* We've gathered the data, so now we can apply some spatialization. */
        switch (ma_spatializer_get_attenuation_model(pSpatializer)) {
            case ma_attenuation_model_inverse:
            {
                gain = ma_attenuation_inverse(distance, minDistance, maxDistance, rolloff);
            } break;
            case ma_attenuation_model_linear:
            {
                gain = ma_attenuation_linear(distance, minDistance, maxDistance, rolloff);
            } break;
            case ma_attenuation_model_exponential:
            {
                gain = ma_attenuation_exponential(distance, minDistance, maxDistance, rolloff);
            } break;
            case ma_attenuation_model_none:
            default:
            {
                gain = 1;
            } break;
        }

        /* Normalize the position. */
        if (distance > 0.001f) {
            float distanceInv = 1/distance;
            relativePosNormalized    = relativePos;
            relativePosNormalized.x *= distanceInv;
            relativePosNormalized.y *= distanceInv;
            relativePosNormalized.z *= distanceInv;
        } else {
            distance = 0;
            relativePosNormalized = ma_vec3f_init_3f(0, 0, 0);
        }

        /*
        Angular attenuation.

        Unlike distance gain, the math for this is not specified by the OpenAL spec so we'll just go ahead and figure
        this out for ourselves at the expense of possibly being inconsistent with other implementations.

        To do cone attenuation, I'm just using the same math that we'd use to implement a basic spotlight in OpenGL. We
        just need to get the direction from the source to the listener and then do a dot product against that and the
        direction of the spotlight. Then we just compare that dot product against the cosine of the inner and outer
        angles. If the dot product is greater than the the outer angle, we just use coneOuterGain. If it's less than
        the inner angle, we just use a gain of 1. Otherwise we linearly interpolate between 1 and coneOuterGain.
        */
        if (distance > 0) {
            /* Source anglular gain. */
            float spatializerConeInnerAngle;
            float spatializerConeOuterAngle;
            float spatializerConeOuterGain;
            ma_spatializer_get_cone(pSpatializer, &spatializerConeInnerAngle, &spatializerConeOuterAngle, &spatializerConeOuterGain);

            gain *= ma_calculate_angular_gain(relativeDir, ma_vec3f_neg(relativePosNormalized), spatializerConeInnerAngle, spatializerConeOuterAngle, spatializerConeOuterGain);

            /*
            We're supporting angular gain on the listener as well for those who want to reduce the volume of sounds that
            are positioned behind the listener. On default settings, this will have no effect.
            */
            if (pListener != NULL && pListener->config.coneInnerAngleInRadians < 6.283185f) {
                ma_vec3f listenerDirection;
                float listenerInnerAngle;
                float listenerOuterAngle;
                float listenerOuterGain;

                if (pListener->config.handedness == ma_handedness_right) {
                    listenerDirection = ma_vec3f_init_3f(0, 0, -1);
                } else {
                    listenerDirection = ma_vec3f_init_3f(0, 0, +1);
                }

                listenerInnerAngle = pListener->config.coneInnerAngleInRadians;
                listenerOuterAngle = pListener->config.coneOuterAngleInRadians;
                listenerOuterGain  = pListener->config.coneOuterGain;

                gain *= ma_calculate_angular_gain(listenerDirection, relativePosNormalized, listenerInnerAngle, listenerOuterAngle, listenerOuterGain);
            }
        } else {
            /* The sound is right on top of the listener. Don't do any angular attenuation. */
        }


        /* Clamp the gain. */
        gain = ma_clamp(gain, ma_spatializer_get_min_gain(pSpatializer), ma_spatializer_get_max_gain(pSpatializer));

        /*
        Panning. This is where we'll apply the gain and convert to the output channel count. We have an optimized path for
        when we're converting to a mono stream. In that case we don't really need to do any panning - we just apply the
        gain to the final output.
        */
        /*printf("distance=%f; gain=%f\n", distance, gain);*/

        /* We must have a valid channel map here to ensure we spatialize properly. */
        MA_ASSERT(pChannelMapOut != NULL);

        /*
        We're not converting to mono so we'll want to apply some panning. This is where the feeling of something being
        to the left, right, infront or behind the listener is calculated. I'm just using a basic model here. Note that
        the code below is not based on any specific algorithm. I'm just implementing this off the top of my head and
        seeing how it goes. There might be better ways to do this.

        To determine the direction of the sound relative to a speaker I'm using dot products. Each speaker is given a
        direction. For example, the left channel in a stereo system will be -1 on the X axis and the right channel will
        be +1 on the X axis. A dot product is performed against the direction vector of the channel and the normalized
        position of the sound.
        */
        for (iChannel = 0; iChannel < channelsOut; iChannel += 1) {
            pSpatializer->pNewChannelGainsOut[iChannel] = gain;
        }

        /*
        Convert to our output channel count. If the listener is disabled we just output silence here. We cannot ignore
        the whole section of code here because we need to update some internal spatialization state.
        */
        if (ma_spatializer_listener_is_enabled(pListener)) {
            ma_channel_map_apply_f32((float*)pFramesOut, pChannelMapOut, channelsOut, (const float*)pFramesIn, pChannelMapIn, channelsIn, frameCount, ma_channel_mix_mode_rectangular, ma_mono_expansion_mode_default);
        } else {
            ma_silence_pcm_frames(pFramesOut, frameCount, ma_format_f32, pSpatializer->channelsOut);
        }

        /*
        Calculate our per-channel gains. We do this based on the normalized relative position of the sound and it's
        relation to the direction of the channel.
        */
        if (distance > 0) {
            ma_vec3f unitPos = relativePos;
            float distanceInv = 1/distance;
            unitPos.x *= distanceInv;
            unitPos.y *= distanceInv;
            unitPos.z *= distanceInv;

            for (iChannel = 0; iChannel < channelsOut; iChannel += 1) {
                ma_channel channelOut;
                float d;
                float dMin;

                channelOut = ma_channel_map_get_channel(pChannelMapOut, channelsOut, iChannel);
                if (ma_is_spatial_channel_position(channelOut)) {
                    d = ma_mix_f32_fast(1, ma_vec3f_dot(unitPos, ma_get_channel_direction(channelOut)), ma_spatializer_get_directional_attenuation_factor(pSpatializer));
                } else {
                    d = 1;  /* It's not a spatial channel so there's no real notion of direction. */
                }

                /*
                In my testing, if the panning effect is too aggressive it makes spatialization feel uncomfortable.
                The "dMin" variable below is used to control the aggressiveness of the panning effect. When set to
                0, panning will be most extreme and any sounds that are positioned on the opposite side of the
                speaker will be completely silent from that speaker. Not only does this feel uncomfortable, it
                doesn't even remotely represent the real world at all because sounds that come from your right side
                are still clearly audible from your left side. Setting "dMin" to 1 will  result in no panning at
                all, which is also not ideal. By setting it to something greater than 0, the spatialization effect
                becomes much less dramatic and a lot more bearable.

                Summary: 0 = more extreme panning; 1 = no panning.
                */
                dMin = 0.2f;  /* TODO: Consider making this configurable. */

                /*
                At this point, "d" will be positive if the sound is on the same side as the channel and negative if
                it's on the opposite side. It will be in the range of -1..1. There's two ways I can think of to
                calculate a panning value. The first is to simply convert it to 0..1, however this has a problem
                which I'm not entirely happy with. Considering a stereo system, when a sound is positioned right
                in front of the listener it'll result in each speaker getting a gain of 0.5. I don't know if I like
                the idea of having a scaling factor of 0.5 being applied to a sound when it's sitting right in front
                of the listener. I would intuitively expect that to be played at full volume, or close to it.

                The second idea I think of is to only apply a reduction in gain when the sound is on the opposite
                side of the speaker. That is, reduce the gain only when the dot product is negative. The problem
                with this is that there will not be any attenuation as the sound sweeps around the 180 degrees
                where the dot product is positive. The idea with this option is that you leave the gain at 1 when
                the sound is being played on the same side as the speaker and then you just reduce the volume when
                the sound is on the other side.

                The summarize, I think the first option should give a better sense of spatialization, but the second
                option is better for preserving the sound's power.

                UPDATE: In my testing, I find the first option to sound better. You can feel the sense of space a
                bit better, but you can also hear the reduction in volume when it's right in front.
                */
                #if 1
                {
                    /*
                    Scale the dot product from -1..1 to 0..1. Will result in a sound directly in front losing power
                    by being played at 0.5 gain.
                    */
                    d = (d + 1) * 0.5f;  /* -1..1 to 0..1 */
                    d = ma_max(d, dMin);
                    pSpatializer->pNewChannelGainsOut[iChannel] *= d;
                }
                #else
                {
                    /*
                    Only reduce the volume of the sound if it's on the opposite side. This path keeps the volume more
                    consistent, but comes at the expense of a worse sense of space and positioning.
                    */
                    if (d < 0) {
                        d += 1; /* Move into the positive range. */
                        d = ma_max(d, dMin);
                        channelGainsOut[iChannel] *= d;
                    }
                }
                #endif
            }
        } else {
            /* Assume the sound is right on top of us. Don't do any panning. */
        }

        /* Now we need to apply the volume to each channel. This needs to run through the gainer to ensure we get a smooth volume transition. */
        ma_gainer_set_gains(&pSpatializer->gainer, pSpatializer->pNewChannelGainsOut);
        ma_gainer_process_pcm_frames(&pSpatializer->gainer, pFramesOut, pFramesOut, frameCount);

        /*
        Before leaving we'll want to update our doppler pitch so that the caller can apply some
        pitch shifting if they desire. Note that we need to negate the relative position here
        because the doppler calculation needs to be source-to-listener, but ours is listener-to-
        source.
        */
        if (dopplerFactor > 0) {
            pSpatializer->dopplerPitch = ma_doppler_pitch(ma_vec3f_sub(pListener->position, pSpatializer->position), pSpatializer->velocity, listenerVel, speedOfSound, dopplerFactor);
        } else {
            pSpatializer->dopplerPitch = 1;
        }
    }

    return MA_SUCCESS;
}